

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_operators.cpp
# Opt level: O1

void test_parse_and_compare_reverse<bool(*)(semver::version<int,int,int>const&,semver::version<int,int,int>const&)noexcept>
               (string_view v1,string_view v2,
               _func_bool_version<int,_int,_int>_ptr_version<int,_int,_int>_ptr *op)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  bool bVar1;
  from_chars_result fVar2;
  string_view str;
  string_view str_00;
  AssertionHandler catchAssertionHandler_1;
  version<int,_int,_int> parsed_v2;
  version<int,_int,_int> parsed_v1;
  SourceLineInfo local_1b8;
  _func_bool_version<int,_int,_int>_ptr_version<int,_int,_int>_ptr *local_1a8;
  AssertionHandler local_1a0;
  char *local_158;
  SourceLineInfo local_150;
  undefined1 local_140 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  local_f0;
  version<int,_int,_int> local_d8;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_158 = v2._M_str;
  str._M_len = v1._M_str;
  local_d8.prerelease_tag_._M_dataplus._M_p = (pointer)&local_d8.prerelease_tag_.field_2;
  local_d8.major_ = 0;
  local_d8.minor_ = 1;
  local_d8.patch_ = 0;
  local_d8.prerelease_tag_._M_string_length = 0;
  local_d8.prerelease_tag_.field_2._M_local_buf[0] = '\0';
  local_d8.build_metadata_._M_dataplus._M_p = (pointer)&local_d8.build_metadata_.field_2;
  local_d8.build_metadata_._M_string_length = 0;
  local_d8.build_metadata_.field_2._M_local_buf[0] = '\0';
  local_d8.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_1a0.m_assertionInfo.macroName.m_size = 7;
  local_1b8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp";
  local_1b8.line = 8;
  local_1a8 = op;
  Catch::StringRef::StringRef(&local_40,"semver::parse(v1, parsed_v1)");
  capturedExpression_00.m_size = local_40.m_size;
  capturedExpression_00.m_start = local_40.m_start;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_140,(StringRef *)&local_1a0,&local_1b8,capturedExpression_00,
             Normal);
  str._M_str = (char *)&local_d8;
  fVar2 = semver::detail::parse<int,int,int>
                    ((detail *)v1._M_len,str,(version<int,_int,_int> *)local_40.m_start);
  local_1a0.m_assertionInfo.macroName.m_start = fVar2.super_from_chars_result.ptr;
  local_1a0.m_assertionInfo.macroName.m_size =
       CONCAT44(local_1a0.m_assertionInfo.macroName.m_size._4_4_,fVar2.super_from_chars_result.ec);
  local_1b8.file = (char *)&local_1a0;
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            ((AssertionHandler *)local_140,(ExprLhs<const_semver::from_chars_result_&> *)&local_1b8)
  ;
  Catch::AssertionHandler::complete((AssertionHandler *)local_140);
  if (local_140[0x3a] == false) {
    (**(code **)(*(long *)CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0])
                + 0x70))();
  }
  local_140._0_8_ = (char *)0x100000000;
  local_140._8_4_ = 0;
  local_140._24_8_ = 0;
  local_140[0x20] = '\0';
  local_140._56_8_ = 0;
  local_100._M_local_buf[0] = '\0';
  local_f0.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.file = "REQUIRE";
  local_1b8.line = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp";
  local_150.line = 0xb;
  local_140._16_8_ = local_140 + 0x20;
  local_140._48_8_ = &local_100;
  Catch::StringRef::StringRef(&local_50,"semver::parse(v2, parsed_v2)");
  capturedExpression.m_size = local_50.m_size;
  capturedExpression.m_start = local_50.m_start;
  Catch::AssertionHandler::AssertionHandler
            (&local_1a0,(StringRef *)&local_1b8,&local_150,capturedExpression,Normal);
  str_00._M_str = local_140;
  str_00._M_len = (size_t)local_158;
  fVar2 = semver::detail::parse<int,int,int>
                    ((detail *)v2._M_len,str_00,(version<int,_int,_int> *)local_50.m_start);
  local_1b8.file = fVar2.super_from_chars_result.ptr;
  local_1b8.line = CONCAT44(local_1b8.line._4_4_,fVar2.super_from_chars_result.ec);
  local_150.file = (char *)&local_1b8;
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            (&local_1a0,(ExprLhs<const_semver::from_chars_result_&> *)&local_150);
  Catch::AssertionHandler::complete(&local_1a0);
  if (local_1a0.m_completed == false) {
    (*(local_1a0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_1b8.file = "REQUIRE";
  local_1b8.line = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp";
  local_150.line = 0xd;
  Catch::StringRef::StringRef(&local_60,"op(parsed_v1, parsed_v2)");
  Catch::AssertionHandler::AssertionHandler
            (&local_1a0,(StringRef *)&local_1b8,&local_150,local_60,Normal);
  bVar1 = (*local_1a8)(&local_d8,(version<int,_int,_int> *)local_140);
  local_1b8.file = (char *)CONCAT71(local_1b8.file._1_7_,bVar1);
  Catch::AssertionHandler::handleExpr<bool>(&local_1a0,(ExprLhs<bool> *)&local_1b8);
  Catch::AssertionHandler::complete(&local_1a0);
  if (local_1a0.m_completed == false) {
    (*(local_1a0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_1b8.file = "REQUIRE";
  local_1b8.line = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp";
  local_150.line = 0xe;
  Catch::StringRef::StringRef(&local_70,"op(parsed_v2, parsed_v1)");
  Catch::AssertionHandler::AssertionHandler
            (&local_1a0,(StringRef *)&local_1b8,&local_150,local_70,Normal);
  bVar1 = (*local_1a8)((version<int,_int,_int> *)local_140,&local_d8);
  local_1b8.file = (char *)CONCAT71(local_1b8.file._1_7_,bVar1);
  Catch::AssertionHandler::handleExpr<bool>(&local_1a0,(ExprLhs<bool> *)&local_1b8);
  Catch::AssertionHandler::complete(&local_1a0);
  if (local_1a0.m_completed == false) {
    (*(local_1a0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::~vector(&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._48_8_ != &local_100) {
    operator_delete((void *)local_140._48_8_,
                    CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_140._16_8_ != local_140 + 0x20) {
    operator_delete((void *)local_140._16_8_,CONCAT71(local_140._33_7_,local_140[0x20]) + 1);
  }
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::~vector(&local_d8.prerelease_identifiers);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.build_metadata_._M_dataplus._M_p != &local_d8.build_metadata_.field_2) {
    operator_delete(local_d8.build_metadata_._M_dataplus._M_p,
                    CONCAT71(local_d8.build_metadata_.field_2._M_allocated_capacity._1_7_,
                             local_d8.build_metadata_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.prerelease_tag_._M_dataplus._M_p != &local_d8.prerelease_tag_.field_2) {
    operator_delete(local_d8.prerelease_tag_._M_dataplus._M_p,
                    CONCAT71(local_d8.prerelease_tag_.field_2._M_allocated_capacity._1_7_,
                             local_d8.prerelease_tag_.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void test_parse_and_compare_reverse(const std::string_view v1, const std::string_view v2, Operator op) {
  semver::version parsed_v1;
  REQUIRE(semver::parse(v1, parsed_v1));

  semver::version parsed_v2;
  REQUIRE(semver::parse(v2, parsed_v2));

  REQUIRE(op(parsed_v1, parsed_v2));
  REQUIRE(op(parsed_v2, parsed_v1));
}